

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Results-ANN-IRIS-Training.cpp
# Opt level: O0

double comparePrediction(MatrixXd *prediction,MatrixXd *label)

{
  int iVar1;
  long lVar2;
  Index IVar3;
  double dVar4;
  int i;
  int wrongPredictions;
  int correctPredictions;
  EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false>_>
  *in_stack_fffffffffffffef8;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  MatrixXd *input;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffffff18;
  MatrixXd local_68 [2];
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_38 [28];
  int local_1c;
  int local_18;
  int local_14;
  
  local_14 = 0;
  local_18 = 0;
  local_1c = 0;
  while( true ) {
    lVar2 = (long)local_1c;
    IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x1427e9);
    if (IVar3 <= lVar2) break;
    input = local_68;
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<1,3>
              (in_stack_ffffffffffffff18,(Index)input,
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    in_stack_ffffffffffffff18 = local_38;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,3,false>>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    iVar1 = matrixMax(input);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<1,3>
              (in_stack_ffffffffffffff18,(Index)input,
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,3,false>>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    in_stack_ffffffffffffff0c = matrixMax(input);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x14288c)
    ;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x142899)
    ;
    if (iVar1 == in_stack_ffffffffffffff0c) {
      local_14 = local_14 + 1;
    }
    else {
      local_18 = local_18 + 1;
    }
    local_1c = local_1c + 1;
  }
  dVar4 = (double)local_14;
  IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x14293d);
  return dVar4 / (double)IVar3;
}

Assistant:

double comparePrediction(Eigen::MatrixXd prediction, Eigen::MatrixXd label) {
    int correctPredictions = 0;
    int wrongPredictions = 0;
    for(int i = 0; i < prediction.rows(); i++) {
        if(matrixMax(prediction.block<1,3>(i,0)) == matrixMax(label.block<1,3>(i,0))) {
            correctPredictions++;
        }
        else {
            wrongPredictions++;
        }
    }
    return (double)correctPredictions / prediction.rows();
}